

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin_open(char *filename,int rwmode,int *handle)

{
  char cVar1;
  int iVar2;
  int local_2c;
  char cbuff;
  int status;
  int *handle_local;
  int rwmode_local;
  char *filename_local;
  
  if (stdin_outfile[0] == '\0') {
    iVar2 = fgetc(_stdin);
    cVar1 = (char)iVar2;
    ungetc((int)cVar1,_stdin);
    if ((cVar1 == '\x1f') || (cVar1 == 'K')) {
      local_2c = mem_compress_stdin_open(filename,rwmode,handle);
    }
    else {
      if (rwmode != 0) {
        ffpmsg("cannot open stdin with WRITE access");
        return 0x70;
      }
      iVar2 = mem_createmem(0xb40,handle);
      if (iVar2 != 0) {
        ffpmsg("failed to create empty memory file (stdin_open)");
        return iVar2;
      }
      local_2c = stdin2mem(*handle);
      if (local_2c != 0) {
        ffpmsg("failed to copy stdin into memory (stdin_open)");
        free(memTable[*handle].memaddr);
      }
    }
  }
  else {
    iVar2 = file_create(stdin_outfile,handle);
    if (iVar2 != 0) {
      ffpmsg("Unable to create output file to copy stdin (stdin_open):");
      ffpmsg(stdin_outfile);
      return iVar2;
    }
    iVar2 = stdin2file(*handle);
    file_close(*handle);
    if (iVar2 != 0) {
      ffpmsg("failed to copy stdin to file (stdin_open)");
      ffpmsg(stdin_outfile);
      return iVar2;
    }
    local_2c = file_open(stdin_outfile,rwmode,handle);
  }
  return local_2c;
}

Assistant:

int stdin_open(char *filename, int rwmode, int *handle)
/*
  open a FITS file from the stdin file stream by copying it into memory
  The file name is ignored in this case.
*/
{
    int status;
    char cbuff;

    if (*stdin_outfile)
    {
      /* copy the stdin stream to the specified disk file then open the file */

      /* Create the output file */
      status =  file_create(stdin_outfile,handle);

      if (status)
      {
        ffpmsg("Unable to create output file to copy stdin (stdin_open):");
        ffpmsg(stdin_outfile);
        return(status);
      }
 
      /* copy the whole stdin stream to the file */
      status = stdin2file(*handle);
      file_close(*handle);

      if (status)
      {
        ffpmsg("failed to copy stdin to file (stdin_open)");
        ffpmsg(stdin_outfile);
        return(status);
      }

      /* reopen file with proper rwmode attribute */
      status = file_open(stdin_outfile, rwmode, handle);
    }
    else
    {
   
      /* get the first character, then put it back */
      cbuff = fgetc(stdin);
      ungetc(cbuff, stdin);
    
      /* compressed files begin with 037 or 'P' */
      if (cbuff == 31 || cbuff == 75)
      {
         /* looks like the input stream is compressed */
         status = mem_compress_stdin_open(filename, rwmode, handle);
	 
      }
      else
      {
        /* copy the stdin stream into memory then open file in memory */

        if (rwmode != READONLY)
        {
          ffpmsg("cannot open stdin with WRITE access");
          return(READONLY_FILE);
        }

        status = mem_createmem(2880L, handle);

        if (status)
        {
          ffpmsg("failed to create empty memory file (stdin_open)");
          return(status);
        }
 
        /* copy the whole stdin stream into memory */
        status = stdin2mem(*handle);

        if (status)
        {
          ffpmsg("failed to copy stdin into memory (stdin_open)");
          free(memTable[*handle].memaddr);
        }
      }
    }

    return(status);
}